

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionParser.cxx
# Opt level: O0

void extendText(cmGeneratorExpressionEvaluatorVector *result,const_iterator it)

{
  vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
  *this;
  bool bVar1;
  int iVar2;
  reference puVar3;
  pointer pcVar4;
  TextContent *this_00;
  pointer pcVar5;
  bool bVar6;
  unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
  local_48;
  unique_ptr<TextContent,_std::default_delete<TextContent>_> local_40;
  __single_object textContent;
  __normal_iterator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_*,_std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>
  local_30;
  __normal_iterator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_*,_std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>
  local_28;
  __normal_iterator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_*,_std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>
  local_20;
  vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
  *local_18;
  cmGeneratorExpressionEvaluatorVector *result_local;
  const_iterator it_local;
  
  local_18 = result;
  result_local = (cmGeneratorExpressionEvaluatorVector *)it._M_current;
  bVar1 = std::
          vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
          ::empty(result);
  bVar6 = false;
  if (!bVar1) {
    local_28._M_current =
         (unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
          *)std::
            vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
            ::end(local_18);
    local_20 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_*,_std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>
               ::operator-(&local_28,1);
    puVar3 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_*,_std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>
             ::operator*(&local_20);
    pcVar4 = std::
             unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
             ::operator->(puVar3);
    iVar2 = (*pcVar4->_vptr_cmGeneratorExpressionEvaluator[2])();
    bVar6 = iVar2 == 0;
  }
  if (bVar6) {
    textContent._M_t.super___uniq_ptr_impl<TextContent,_std::default_delete<TextContent>_>._M_t.
    super__Tuple_impl<0UL,_TextContent_*,_std::default_delete<TextContent>_>.
    super__Head_base<0UL,_TextContent_*,_false>._M_head_impl =
         (__uniq_ptr_data<TextContent,_std::default_delete<TextContent>,_true,_true>)
         std::
         vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
         ::end(local_18);
    local_30 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_*,_std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>
               ::operator-((__normal_iterator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_*,_std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>
                            *)&textContent,1);
    puVar3 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_*,_std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>
             ::operator*(&local_30);
    this_00 = cm::
              static_reference_cast<TextContent,_std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_0>
                        (puVar3);
    pcVar5 = __gnu_cxx::
             __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
             ::operator->((__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                           *)&result_local);
    TextContent::Extend(this_00,pcVar5->Length);
  }
  else {
    pcVar5 = __gnu_cxx::
             __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
             ::operator->((__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                           *)&result_local);
    __gnu_cxx::
    __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
    ::operator->((__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                  *)&result_local);
    std::make_unique<TextContent,char_const*const&,unsigned_long_const&>
              ((char **)&local_40,(unsigned_long *)&pcVar5->Content);
    this = local_18;
    std::
    unique_ptr<cmGeneratorExpressionEvaluator,std::default_delete<cmGeneratorExpressionEvaluator>>::
    unique_ptr<TextContent,std::default_delete<TextContent>,void>
              ((unique_ptr<cmGeneratorExpressionEvaluator,std::default_delete<cmGeneratorExpressionEvaluator>>
                *)&local_48,&local_40);
    std::
    vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
    ::push_back(this,(value_type *)&local_48);
    std::
    unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>
    ::~unique_ptr(&local_48);
    std::unique_ptr<TextContent,_std::default_delete<TextContent>_>::~unique_ptr(&local_40);
  }
  return;
}

Assistant:

static void extendText(
  cmGeneratorExpressionEvaluatorVector& result,
  std::vector<cmGeneratorExpressionToken>::const_iterator it)
{
  if (!result.empty() &&
      (*(result.end() - 1))->GetType() ==
        cmGeneratorExpressionEvaluator::Text) {
    cm::static_reference_cast<TextContent>(*(result.end() - 1))
      .Extend(it->Length);
  } else {
    auto textContent = cm::make_unique<TextContent>(it->Content, it->Length);
    result.push_back(std::move(textContent));
  }
}